

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

void __thiscall
ON_Layer::CullPerViewportSettings(ON_Layer *this,int viewport_id_count,ON_UUID *viewport_id_list)

{
  ON__UINT8 *layer_m_extension_bits;
  uchar *puVar1;
  ON_UUID *pOVar2;
  long lVar3;
  bool bVar4;
  ON__LayerExtensions *pOVar5;
  long lVar6;
  int i;
  undefined1 auVar7 [16];
  ON_UUID vp_id;
  
  layer_m_extension_bits = &this->m_extension_bits;
  pOVar5 = ON__LayerExtensions::LayerExtensions(this,layer_m_extension_bits,false);
  if (pOVar5 == (ON__LayerExtensions *)0x0) {
    return;
  }
  if (0 < viewport_id_count) {
    if (viewport_id_list == (ON_UUID *)0x0) {
      return;
    }
    i = (pOVar5->m_vp_settings).m_count;
    lVar6 = (long)i;
    if (lVar6 != 0) {
      pOVar2 = viewport_id_list + lVar6;
      lVar3 = lVar6 * 0x28;
      do {
        i = i + -1;
        puVar1 = (pOVar5->m_vp_settings).m_a[-1].m_viewport_id.Data4 + lVar3 + -8;
        auVar7[0] = -((uchar)pOVar2[-1].Data1 == *puVar1);
        auVar7[1] = -(*(uchar *)((long)&pOVar2[-1].Data1 + 1) == puVar1[1]);
        auVar7[2] = -(*(uchar *)((long)&pOVar2[-1].Data1 + 2) == puVar1[2]);
        auVar7[3] = -(*(uchar *)((long)&pOVar2[-1].Data1 + 3) == puVar1[3]);
        auVar7[4] = -((uchar)pOVar2[-1].Data2 == puVar1[4]);
        auVar7[5] = -(*(uchar *)((long)&pOVar2[-1].Data2 + 1) == puVar1[5]);
        auVar7[6] = -((uchar)pOVar2[-1].Data3 == puVar1[6]);
        auVar7[7] = -(*(uchar *)((long)&pOVar2[-1].Data3 + 1) == puVar1[7]);
        auVar7[8] = -(pOVar2[-1].Data4[0] == puVar1[8]);
        auVar7[9] = -(pOVar2[-1].Data4[1] == puVar1[9]);
        auVar7[10] = -(pOVar2[-1].Data4[2] == puVar1[10]);
        auVar7[0xb] = -(pOVar2[-1].Data4[3] == puVar1[0xb]);
        auVar7[0xc] = -(pOVar2[-1].Data4[4] == puVar1[0xc]);
        auVar7[0xd] = -(pOVar2[-1].Data4[5] == puVar1[0xd]);
        auVar7[0xe] = -(pOVar2[-1].Data4[6] == puVar1[0xe]);
        auVar7[0xf] = -(pOVar2[-1].Data4[7] == puVar1[0xf]);
        if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar7[0xf] >> 7) << 0xf) != 0xffff) {
          ON_SimpleArray<ON__LayerPerViewSettings>::Remove(&pOVar5->m_vp_settings,i);
        }
        lVar6 = lVar6 + -1;
        pOVar2 = pOVar2 + -1;
        lVar3 = lVar3 + -0x28;
      } while (lVar6 != 0);
    }
    bVar4 = ON__LayerExtensions::IsEmpty(pOVar5);
    if (!bVar4) {
      return;
    }
  }
  pOVar5 = ON__LayerExtensions::LayerExtensions(this,layer_m_extension_bits,false);
  if (pOVar5 != (ON__LayerExtensions *)0x0) {
    (*(pOVar5->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar5);
    *layer_m_extension_bits = *layer_m_extension_bits | 1;
  }
  return;
}

Assistant:

void ON_Layer::CullPerViewportSettings( int viewport_id_count, const ON_UUID* viewport_id_list )
{
  ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
  if ( 0 != ud )
  {
    if ( viewport_id_count <= 0 )
    {
      // delete all per viewport settings
      ON__LayerExtensions::DeleteViewportSettings( *this, &m_extension_bits, 0 );
      ud = 0;
    }
    else if ( viewport_id_count > 0 && 0 != viewport_id_list )
    {
      int i, j;
      for ( i = ud->m_vp_settings.Count(); i--; /*empty iterator*/ )
      {
        const ON_UUID vp_id = ud->m_vp_settings[i].m_viewport_id;
        for ( j = 0; j < viewport_id_count; j++ )
        {
          if ( 0 == memcmp(&viewport_id_list[i],&vp_id,sizeof(vp_id)) )
            break;
        }
        if ( j >= viewport_id_count )
        {
          // ud->m_vp_settings[i].m_viewport_id is NOT in viewport_id_list[]
          ud->m_vp_settings.Remove(i);
        }
      }
      if ( ud->IsEmpty() )
      {
        // nothing useful in ud
        ON__LayerExtensions::DeleteViewportSettings( *this, &m_extension_bits, 0 );
        ud = 0;
      }
    }
  }
}